

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O2

void crunch(membuf *inbuf,membuf *outbuf,crunch_options *options,crunch_info *info)

{
  int iVar1;
  
  reverse_buffer((char *)inbuf->buf,inbuf->len);
  iVar1 = outbuf->len;
  crunch_backwards(inbuf,outbuf,options,info);
  reverse_buffer((char *)inbuf->buf,inbuf->len);
  reverse_buffer((char *)((long)iVar1 + (long)outbuf->buf),outbuf->len - iVar1);
  return;
}

Assistant:

void crunch(struct membuf *inbuf,
            struct membuf *outbuf,
            struct crunch_options *options, /* IN */
            struct crunch_info *info) /* OUT */
{
    int outpos;
    reverse_buffer(membuf_get(inbuf), membuf_memlen(inbuf));
    outpos = membuf_memlen(outbuf);

    crunch_backwards(inbuf, outbuf, options, info);

    reverse_buffer(membuf_get(inbuf), membuf_memlen(inbuf));
    reverse_buffer((char*)membuf_get(outbuf) + outpos,
                   membuf_memlen(outbuf) - outpos);
}